

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

void __thiscall
gmath::RadialDistortion::RadialDistortion(RadialDistortion *this,Properties *prop,int id)

{
  Distortion *in_RDI;
  int in_stack_00000104;
  char *in_stack_00000108;
  char *in_stack_000001b8;
  double *in_stack_000001c0;
  char *in_stack_000001c8;
  Properties *in_stack_000001d0;
  string local_88 [32];
  string local_68 [48];
  string local_38 [56];
  
  Distortion::Distortion(in_RDI);
  in_RDI->_vptr_Distortion = (_func_int **)&PTR__RadialDistortion_001c5978;
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_00000108,in_stack_00000104);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001b8);
  std::__cxx11::string::~string(local_38);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_00000108,in_stack_00000104);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001b8);
  std::__cxx11::string::~string(local_68);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_00000108,in_stack_00000104);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001b8);
  std::__cxx11::string::~string(local_88);
  *(undefined4 *)&in_RDI[1]._vptr_Distortion = 0;
  if (((double)in_RDI[4]._vptr_Distortion != 0.0) || (NAN((double)in_RDI[4]._vptr_Distortion))) {
    *(int *)&in_RDI[1]._vptr_Distortion = *(int *)&in_RDI[1]._vptr_Distortion + 1;
  }
  if ((((double)in_RDI[3]._vptr_Distortion != 0.0) || (NAN((double)in_RDI[3]._vptr_Distortion))) ||
     (0 < *(int *)&in_RDI[1]._vptr_Distortion)) {
    *(int *)&in_RDI[1]._vptr_Distortion = *(int *)&in_RDI[1]._vptr_Distortion + 1;
  }
  if ((((double)in_RDI[2]._vptr_Distortion != 0.0) || (NAN((double)in_RDI[2]._vptr_Distortion))) ||
     (0 < *(int *)&in_RDI[1]._vptr_Distortion)) {
    *(int *)&in_RDI[1]._vptr_Distortion = *(int *)&in_RDI[1]._vptr_Distortion + 1;
  }
  return;
}

Assistant:

RadialDistortion::RadialDistortion(const gutil::Properties &prop, int id)
{
  prop.getValue(getCameraKey("k1", id).c_str(), kd[0], "0");
  prop.getValue(getCameraKey("k2", id).c_str(), kd[1], "0");
  prop.getValue(getCameraKey("k3", id).c_str(), kd[2], "0");

  kn=0;

  if (kd[2] != 0)
  {
    kn++;
  }

  if (kd[1] != 0 || kn > 0)
  {
    kn++;
  }

  if (kd[0] != 0 || kn > 0)
  {
    kn++;
  }
}